

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,FunctionBody *func_body,void *data)

{
  bool bVar1;
  pointer pSVar2;
  long in_RSI;
  String *in_RDI;
  String *self;
  Guard g_1;
  Guard g;
  String *in_stack_fffffffffffffec0;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffec8;
  Stack *__f;
  function<void_()> *in_stack_fffffffffffffed0;
  State *this_00;
  SemanticAnalysisVisitor *this_01;
  State local_100;
  SemanticAnalysisVisitor local_58 [3];
  long local_10;
  
  this_01 = local_58;
  local_10 = in_RSI;
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::FunctionBody*,void*)::__0,void>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::FunctionBody*,void*)::__1,void>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  Guard::Guard((Guard *)this_01,(function<void_()> *)in_RDI,in_stack_fffffffffffffed0);
  std::function<void_()>::~function((function<void_()> *)0x19300b);
  std::function<void_()>::~function((function<void_()> *)0x193018);
  __f = &local_100.stack_;
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::FunctionBody*,void*)::__2,void>
            (in_stack_fffffffffffffed0,(anon_class_8_1_8991fb9c *)__f);
  this_00 = &local_100;
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::FunctionBody*,void*)::__3,void>
            ((function<void_()> *)this_00,(anon_class_8_1_8991fb9c *)__f);
  Guard::Guard((Guard *)this_01,(function<void_()> *)in_RDI,(function<void_()> *)this_00);
  std::function<void_()>::~function((function<void_()> *)0x193077);
  std::function<void_()>::~function((function<void_()> *)0x193081);
  if ((*(byte *)(local_10 + 0x18) & 1) != 0) {
    in_stack_fffffffffffffec0 = State::GetString(this_00,(char *)__f);
    InsertName(this_01,in_RDI);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x193166);
  if (bVar1) {
    pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                       ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                        0x19317d);
    (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,0);
  }
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1931a7);
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,0);
  Guard::~Guard((Guard *)in_stack_fffffffffffffec0);
  Guard::~Guard((Guard *)in_stack_fffffffffffffec0);
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(FunctionBody *func_body, void *data)
    {
        SEMANTIC_ANALYSIS_GUARD(EnterFunction, LeaveFunction);
        {
            SEMANTIC_ANALYSIS_GUARD(EnterBlock, LeaveBlock);

            if (func_body->has_self_)
            {
                auto self = state_->GetString("self");
                InsertName(self);
            }

            if (func_body->param_list_)
                func_body->param_list_->Accept(this, nullptr);

            func_body->block_->Accept(this, nullptr);
        }
    }